

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O0

void __thiscall CMenus::RenderMenubar(CMenus *this,CUIRect Rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IClient *pIVar4;
  CButtonContainer *pBC;
  CConfig *pCVar5;
  char *pcVar6;
  IServerBrowser *pIVar7;
  CUI *pRect;
  long in_RDI;
  long in_FS_OFFSET;
  float NotActiveAlpha_1;
  int Corners_1;
  float ButtonWidth_2;
  float Spacing_2;
  int Corners;
  float NotActiveAlpha;
  float ButtonWidth_1;
  float Spacing_1;
  int NumButtons_1;
  float Alpha;
  float ButtonWidth;
  float Spacing;
  int NumButtons;
  int NewPage;
  float InactiveAlpha;
  CUIRect Button_1;
  CUIRect Right_1;
  CUIRect Left_1;
  CUIRect Right;
  CUIRect Left;
  CUIRect Button;
  CUIRect Box;
  float in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  float in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  CMenus *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe64;
  float in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  CUIRect *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined1 uVar8;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined1 uVar10;
  float Rounding;
  float fVar9;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar11;
  CMenus *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  uint uVar12;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  CUIRect *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffee0;
  undefined4 local_fc;
  int local_a8;
  vector4_base<float> local_98 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CUIRect::HSplitTop((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     in_stack_fffffffffffffe34,
                     (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (CUIRect *)0x174046);
  *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x1c);
  local_a8 = -1;
  pIVar4 = CComponent::Client((CComponent *)0x174075);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 != 0) {
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x10);
  }
  pIVar4 = CComponent::Client((CComponent *)0x17409d);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 3) {
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x174188);
    CUIRect::VSplitRight
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x1741c3);
    RenderBackgroundShadow
              ((CMenus *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
    RenderBackgroundShadow
              ((CMenus *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
    CUIRect::HSplitBottom
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x17421d);
    CUIRect::HSplitBottom
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x174239);
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x17425a);
    if ((RenderMenubar(CUIRect)::s_GameButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GameButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_GameButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_GameButton);
    }
    Localize((char *)in_stack_fffffffffffffe40,
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = DoButton_MenuTabTop((CMenus *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (CButtonContainer *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),
                                (CUIRect *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                                in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      local_a8 = 1;
    }
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x174361);
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x174382);
    if ((RenderMenubar(CUIRect)::s_PlayersButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_PlayersButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_PlayersButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_PlayersButton);
    }
    Localize((char *)in_stack_fffffffffffffe40,
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = DoButton_MenuTabTop((CMenus *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (CButtonContainer *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),
                                (CUIRect *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                                in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      local_a8 = 2;
    }
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x174489);
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x1744aa);
    if ((RenderMenubar(CUIRect)::s_ServerInfoButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ServerInfoButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_ServerInfoButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_ServerInfoButton);
    }
    Localize((char *)in_stack_fffffffffffffe40,
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = DoButton_MenuTabTop((CMenus *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (CButtonContainer *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),
                                (CUIRect *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                                in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      local_a8 = 3;
    }
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x1745b1);
    CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,
                        (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (CUIRect *)0x1745d2);
    if ((RenderMenubar(CUIRect)::s_CallVoteButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_CallVoteButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_CallVoteButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_CallVoteButton);
    }
    Localize((char *)in_stack_fffffffffffffe40,
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = DoButton_MenuTabTop((CMenus *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (CButtonContainer *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),
                                (CUIRect *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                                in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      local_a8 = 4;
    }
    CUIRect::VSplitRight
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x1746dd);
    if ((RenderMenubar(CUIRect)::s_SettingsButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_SettingsButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_SettingsButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_SettingsButton);
    }
    Localize((char *)in_stack_fffffffffffffe40,
             (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = DoButton_MenuTabTop((CMenus *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (CButtonContainer *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0),
                                (CUIRect *)
                                CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                                SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                                in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      local_a8 = 8;
    }
    CUIRect::VSplitRight
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x1747dd);
    CUIRect::VSplitRight
              ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (CUIRect *)0x17480a);
    if ((RenderMenubar(CUIRect)::s_ServerBrowserButton == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ServerBrowserButton), iVar2 != 0)) {
      CButtonContainer::CButtonContainer(&RenderMenubar::s_ServerBrowserButton,false);
      __cxa_guard_release(&RenderMenubar(CUIRect)::s_ServerBrowserButton);
    }
    CComponent::UI((CComponent *)0x17484d);
    CUI::MouseHovered((CUI *)in_stack_fffffffffffffe40,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffe30 = 1;
    in_stack_fffffffffffffe28 = 2.10195e-44;
    bVar1 = DoButton_SpriteID(in_stack_fffffffffffffe90,
                              (CButtonContainer *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                              (bool)in_stack_fffffffffffffe7f,in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffee0,in_stack_fffffffffffffe6c,
                              SUB41((uint)in_stack_fffffffffffffe68 >> 0x18,0));
    if ((bVar1) ||
       (bVar1 = CheckHotKey((CMenus *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe2c), bVar1)) {
      pIVar7 = CComponent::ServerBrowser((CComponent *)0x17495f);
      iVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[2])();
      local_a8 = 6;
      if (iVar2 == 0) {
        local_a8 = 5;
      }
    }
    CUIRect::HSplitTop((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe34,
                       (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (CUIRect *)0x1749c9);
    CUIRect::HSplitTop((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe34,
                       (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (CUIRect *)0x1749e9);
  }
  uVar10 = (undefined1)((uint)in_stack_fffffffffffffe84 >> 0x18);
  pIVar4 = CComponent::Client((CComponent *)0x1749f6);
  iVar2 = IClient::State(pIVar4);
  if ((iVar2 != 0) || (*(int *)(in_RDI + 0x1c) != 8)) {
    pIVar4 = CComponent::Client((CComponent *)0x174a1e);
    iVar2 = IClient::State(pIVar4);
    if ((iVar2 != 3) || (*(int *)(in_RDI + 0x10) != 8)) {
      pIVar4 = CComponent::Client((CComponent *)0x17547c);
      iVar2 = IClient::State(pIVar4);
      if (((iVar2 != 0) || (*(int *)(in_RDI + 0x1c) < 5)) || (6 < *(int *)(in_RDI + 0x1c))) {
        pIVar4 = CComponent::Client((CComponent *)0x1754b2);
        iVar2 = IClient::State(pIVar4);
        if (((iVar2 != 3) || (*(int *)(in_RDI + 0x10) < 5)) || (6 < *(int *)(in_RDI + 0x10))) {
          pIVar4 = CComponent::Client((CComponent *)0x175a80);
          iVar2 = IClient::State(pIVar4);
          if ((iVar2 == 0) && (*(int *)(in_RDI + 0x1c) == 7)) {
            RenderBackgroundShadow
                      ((CMenus *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (CUIRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
            CUIRect::HSplitBottom
                      ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe34,
                       (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (CUIRect *)0x175ade);
            vector4_base<float>::vector4_base(local_98,1.0,1.0,1.0,0.75);
            CUIRect::Draw(in_stack_fffffffffffffea8,
                          (vec4 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
            pRect = CComponent::UI((CComponent *)0x175b30);
            Localize((char *)in_stack_fffffffffffffe40,
                     (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            CUI::DoLabelSelected
                      ((CUI *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (CUIRect *)pRect,(char *)in_stack_fffffffffffffe40,
                       SUB41((uint)in_stack_fffffffffffffe3c >> 0x18,0),in_stack_fffffffffffffe38,
                       (int)in_stack_fffffffffffffe34);
          }
          goto LAB_00175b82;
        }
      }
      pIVar4 = CComponent::Client((CComponent *)0x175554);
      IClient::State(pIVar4);
      pIVar4 = CComponent::Client((CComponent *)0x175582);
      iVar2 = IClient::State(pIVar4);
      Rounding = 0.5;
      if (iVar2 != 3) {
        Rounding = 1.0;
      }
      fVar9 = Rounding;
      CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe34,
                          (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (CUIRect *)0x1755f9);
      uVar10 = (undefined1)((uint)fVar9 >> 0x18);
      pIVar4 = CComponent::Client((CComponent *)0x175606);
      iVar2 = IClient::State(pIVar4);
      if (iVar2 == 0) {
        RenderBackgroundShadow
                  ((CMenus *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   (CUIRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
      }
      CUIRect::HSplitBottom
                ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 in_stack_fffffffffffffe34,
                 (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (CUIRect *)0x17564e);
      CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe34,
                          (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (CUIRect *)0x17566f);
      if ((RenderMenubar(CUIRect)::s_InternetButton == '\0') &&
         (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_InternetButton), iVar2 != 0)) {
        CButtonContainer::CButtonContainer(&RenderMenubar::s_InternetButton,false);
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_InternetButton);
      }
      pcVar6 = Localize((char *)in_stack_fffffffffffffe40,
                        (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      uVar8 = false;
      if (*(int *)(in_RDI + 0x18) == 5) {
        pIVar4 = CComponent::Client((CComponent *)0x1756de);
        iVar2 = IClient::State(pIVar4);
        uVar8 = iVar2 == 0;
      }
      iVar2 = CONCAT13(uVar8,SUB43(in_stack_fffffffffffffe6c,0));
      if (*(int *)(in_RDI + 0x18) == 5) {
        Rounding = 1.0;
      }
      bVar1 = DoButton_MenuTabTop((CMenus *)
                                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                  (CButtonContainer *)in_stack_fffffffffffffe90,
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),(bool)uVar10,
                                  (CUIRect *)CONCAT17(uVar8,in_stack_fffffffffffffe78),
                                  (float)((ulong)pcVar6 >> 0x20),SUB84(pcVar6,0),iVar2,Rounding,
                                  in_stack_fffffffffffffe64);
      if ((bVar1) ||
         (bVar1 = CheckHotKey((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe2c), bVar1)) {
        CCamera::ChangePosition
                  ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c);
        pIVar7 = CComponent::ServerBrowser((CComponent *)0x1757ba);
        (*(pIVar7->super_IInterface)._vptr_IInterface[3])(pIVar7,0);
        local_a8 = 5;
        pCVar5 = CComponent::Config((CComponent *)0x1757dd);
        pCVar5->m_UiBrowserPage = 5;
      }
      CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe34,
                          (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (CUIRect *)0x17582f);
      CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe34,
                          (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (CUIRect *)0x175850);
      if ((RenderMenubar(CUIRect)::s_LanButton == '\0') &&
         (iVar3 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_LanButton), iVar3 != 0)) {
        CButtonContainer::CButtonContainer(&RenderMenubar::s_LanButton,false);
        __cxa_guard_release(&RenderMenubar(CUIRect)::s_LanButton);
      }
      Localize((char *)in_stack_fffffffffffffe40,
               (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      in_stack_fffffffffffffe64 = (float)((uint)in_stack_fffffffffffffe64 & 0xffffff);
      if (*(int *)(in_RDI + 0x18) == 6) {
        pIVar4 = CComponent::Client((CComponent *)0x1758bf);
        iVar3 = IClient::State(pIVar4);
        in_stack_fffffffffffffe64 = (float)CONCAT13(iVar3 == 0,SUB43(in_stack_fffffffffffffe64,0));
      }
      bVar1 = DoButton_MenuTabTop((CMenus *)
                                  CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                  (CButtonContainer *)in_stack_fffffffffffffe90,
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),(bool)uVar10,
                                  (CUIRect *)CONCAT17(uVar8,in_stack_fffffffffffffe78),
                                  (float)((ulong)pcVar6 >> 0x20),SUB84(pcVar6,0),iVar2,Rounding,
                                  in_stack_fffffffffffffe64);
      if ((bVar1) ||
         (bVar1 = CheckHotKey((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                              in_stack_fffffffffffffe2c), bVar1)) {
        CCamera::ChangePosition
                  ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c);
        pIVar7 = CComponent::ServerBrowser((CComponent *)0x17599b);
        (*(pIVar7->super_IInterface)._vptr_IInterface[3])(pIVar7,1);
        local_a8 = 6;
        pCVar5 = CComponent::Config((CComponent *)0x1759c1);
        pCVar5->m_UiBrowserPage = 6;
      }
      pIVar4 = CComponent::Client((CComponent *)0x175a03);
      iVar2 = IClient::State(pIVar4);
      if (iVar2 == 0) {
        CUIRect::VSplitRight
                  ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,
                   (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (CUIRect *)0x175a2c);
        CUIRect::VSplitRight
                  ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,
                   (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (CUIRect *)0x175a4d);
        CUIRect::HSplitBottom
                  ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe34,
                   (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (CUIRect *)0x175a6e);
      }
      goto LAB_00175b82;
    }
  }
  pIVar4 = CComponent::Client((CComponent *)0x174ab5);
  iVar2 = IClient::State(pIVar4);
  local_fc = 0x3f000000;
  if (iVar2 != 3) {
    local_fc = 0x3f800000;
  }
  pIVar4 = CComponent::Client((CComponent *)0x174b15);
  IClient::State(pIVar4);
  pIVar4 = CComponent::Client((CComponent *)0x174b43);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 0) {
    RenderBackgroundShadow
              ((CMenus *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (CUIRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0),in_stack_fffffffffffffe28);
  }
  CUIRect::HSplitBottom
            ((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             in_stack_fffffffffffffe34,
             (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (CUIRect *)0x174b8b);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x174bac);
  if ((RenderMenubar(CUIRect)::s_GeneralButton == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GeneralButton), iVar2 != 0)) {
    CButtonContainer::CButtonContainer(&RenderMenubar::s_GeneralButton,false);
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_GeneralButton);
  }
  Localize((char *)in_stack_fffffffffffffe40,
           (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pIVar4 = CComponent::Client((CComponent *)0x174c0a);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 0) {
    CComponent::Config((CComponent *)0x174c2f);
  }
  CComponent::Config((CComponent *)0x174c5b);
  bVar1 = DoButton_MenuTabTop((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (CButtonContainer *)in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (bool)uVar10,
                              (CUIRect *)
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                              (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                              SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  if (bVar1) {
    CCamera::ChangePosition
              ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    pCVar5 = CComponent::Config((CComponent *)0x174d0e);
    pCVar5->m_UiSettingsPage = 0;
  }
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x174d60);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x174d81);
  if ((RenderMenubar(CUIRect)::s_PlayerButton == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_PlayerButton), iVar2 != 0)) {
    CButtonContainer::CButtonContainer(&RenderMenubar::s_PlayerButton,false);
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_PlayerButton);
  }
  Localize((char *)in_stack_fffffffffffffe40,
           (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pIVar4 = CComponent::Client((CComponent *)0x174ddf);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 0) {
    CComponent::Config((CComponent *)0x174e04);
  }
  CComponent::Config((CComponent *)0x174e30);
  bVar1 = DoButton_MenuTabTop((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (CButtonContainer *)in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (bool)uVar10,
                              (CUIRect *)
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                              (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                              SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  if (bVar1) {
    CCamera::ChangePosition
              ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    pCVar5 = CComponent::Config((CComponent *)0x174ee3);
    pCVar5->m_UiSettingsPage = 1;
  }
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x174f35);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x174f56);
  if ((RenderMenubar(CUIRect)::s_ControlsButton == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_ControlsButton), iVar2 != 0)) {
    CButtonContainer::CButtonContainer(&RenderMenubar::s_ControlsButton,false);
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_ControlsButton);
  }
  Localize((char *)in_stack_fffffffffffffe40,
           (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pIVar4 = CComponent::Client((CComponent *)0x174fb4);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 0) {
    CComponent::Config((CComponent *)0x174fd9);
  }
  CComponent::Config((CComponent *)0x175005);
  bVar1 = DoButton_MenuTabTop((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (CButtonContainer *)in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (bool)uVar10,
                              (CUIRect *)
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                              (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                              SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  if (bVar1) {
    CCamera::ChangePosition
              ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    pCVar5 = CComponent::Config((CComponent *)0x1750b8);
    pCVar5->m_UiSettingsPage = 3;
  }
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x17510a);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x17512b);
  if ((RenderMenubar(CUIRect)::s_GraphicsButton == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_GraphicsButton), iVar2 != 0)) {
    CButtonContainer::CButtonContainer(&RenderMenubar::s_GraphicsButton,false);
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_GraphicsButton);
  }
  Localize((char *)in_stack_fffffffffffffe40,
           (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pIVar4 = CComponent::Client((CComponent *)0x175189);
  iVar2 = IClient::State(pIVar4);
  if (iVar2 == 0) {
    CComponent::Config((CComponent *)0x1751ae);
  }
  CComponent::Config((CComponent *)0x1751d7);
  bVar1 = DoButton_MenuTabTop((CMenus *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (CButtonContainer *)in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (bool)uVar10,
                              (CUIRect *)
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                              (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                              SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  if (bVar1) {
    CCamera::ChangePosition
              ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    pCVar5 = CComponent::Config((CComponent *)0x17527e);
    pCVar5->m_UiSettingsPage = 4;
  }
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x1752d0);
  CUIRect::VSplitLeft((CUIRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                      in_stack_fffffffffffffe34,
                      (CUIRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (CUIRect *)0x1752f1);
  if ((RenderMenubar(CUIRect)::s_SoundButton == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderMenubar(CUIRect)::s_SoundButton), iVar2 != 0)) {
    CButtonContainer::CButtonContainer(&RenderMenubar::s_SoundButton,false);
    __cxa_guard_release(&RenderMenubar(CUIRect)::s_SoundButton);
  }
  pBC = (CButtonContainer *)
        Localize((char *)in_stack_fffffffffffffe40,
                 (char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pIVar4 = CComponent::Client((CComponent *)0x17534c);
  iVar2 = IClient::State(pIVar4);
  uVar12 = (uint)in_stack_fffffffffffffe9c & 0xffffff;
  if (iVar2 == 0) {
    pCVar5 = CComponent::Config((CComponent *)0x17536e);
    uVar12 = CONCAT13(pCVar5->m_UiSettingsPage == 5,(int3)uVar12);
  }
  uVar11 = CONCAT13((char)(uVar12 >> 0x18),(int3)in_stack_fffffffffffffe8c);
  pCVar5 = CComponent::Config((CComponent *)0x175391);
  if (pCVar5->m_UiSettingsPage == 5) {
    local_fc = 0x3f800000;
  }
  bVar1 = DoButton_MenuTabTop((CMenus *)CONCAT44(uVar12,in_stack_fffffffffffffe98),pBC,
                              (char *)CONCAT44(uVar11,local_fc),(bool)uVar10,
                              (CUIRect *)
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                              (float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                              SUB84(in_stack_fffffffffffffe70,0),(int)in_stack_fffffffffffffe6c,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  if (bVar1) {
    CCamera::ChangePosition
              ((CCamera *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    pCVar5 = CComponent::Config((CComponent *)0x175435);
    pCVar5->m_UiSettingsPage = 5;
  }
LAB_00175b82:
  if (local_a8 != -1) {
    pIVar4 = CComponent::Client((CComponent *)0x175b99);
    iVar2 = IClient::State(pIVar4);
    if (iVar2 == 0) {
      SetMenuPage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
    else {
      *(int *)(in_RDI + 0x10) = local_a8;
      if ((local_a8 == 5) || (local_a8 == 6)) {
        SetMenuPage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMenus::RenderMenubar(CUIRect Rect)
{
	CUIRect Box;
	CUIRect Button;
	Rect.HSplitTop(60.0f, &Box, &Rect);
	const float InactiveAlpha = 0.25f;

	m_ActivePage = m_MenuPage;
	int NewPage = -1;

	if(Client()->State() != IClient::STATE_OFFLINE)
		m_ActivePage = m_GamePage;

	if(Client()->State() == IClient::STATE_ONLINE)
	{
		int NumButtons = 6;
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/NumButtons)-(Spacing*(NumButtons-1))/NumButtons;
		float Alpha = 1.0f;
		if(m_GamePage == PAGE_SETTINGS)
			Alpha = InactiveAlpha;

		// render header backgrounds
		CUIRect Left, Right;
		Box.VSplitLeft(ButtonWidth*4.0f + Spacing*3.0f, &Left, 0);
		Box.VSplitRight(ButtonWidth*1.5f + Spacing, 0, &Right);
		RenderBackgroundShadow(&Left, false);
		RenderBackgroundShadow(&Right, false);

		Left.HSplitBottom(25.0f, 0, &Left);
		Right.HSplitBottom(25.0f, 0, &Right);

		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_GameButton;
		if(DoButton_MenuTabTop(&s_GameButton, Localize("Game"), m_ActivePage == PAGE_GAME, &Button, Alpha, Alpha) || CheckHotKey(KEY_G))
			NewPage = PAGE_GAME;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_PlayersButton;
		if(DoButton_MenuTabTop(&s_PlayersButton, Localize("Players"), m_ActivePage == PAGE_PLAYERS, &Button, Alpha, Alpha) || CheckHotKey(KEY_P))
			NewPage = PAGE_PLAYERS;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_ServerInfoButton;
		if(DoButton_MenuTabTop(&s_ServerInfoButton, Localize("Server info"), m_ActivePage == PAGE_SERVER_INFO, &Button, Alpha, Alpha) || CheckHotKey(KEY_I))
			NewPage = PAGE_SERVER_INFO;

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_CallVoteButton;
		if(DoButton_MenuTabTop(&s_CallVoteButton, Localize("Call vote"), m_ActivePage == PAGE_CALLVOTE, &Button, Alpha, Alpha) || CheckHotKey(KEY_V))
			NewPage = PAGE_CALLVOTE;

		Right.VSplitRight(ButtonWidth, &Right, &Button);
		static CButtonContainer s_SettingsButton;
		if(DoButton_MenuTabTop(&s_SettingsButton, Localize("Settings"), m_GamePage == PAGE_SETTINGS, &Button) || CheckHotKey(KEY_S))
			NewPage = PAGE_SETTINGS;

		Right.VSplitRight(Spacing, &Right, 0); // little space
		Right.VSplitRight(ButtonWidth/2.0f, &Right, &Button);
		static CButtonContainer s_ServerBrowserButton;
		if(DoButton_SpriteID(&s_ServerBrowserButton, IMAGE_BROWSER, UI()->MouseHovered(&Button) || m_GamePage == PAGE_INTERNET || m_GamePage == PAGE_LAN ? SPRITE_BROWSER_B : SPRITE_BROWSER_A,
			m_GamePage == PAGE_INTERNET || m_GamePage == PAGE_LAN, &Button) || CheckHotKey(KEY_B))
		{
			NewPage = ServerBrowser()->GetType() == IServerBrowser::TYPE_INTERNET ? PAGE_INTERNET : PAGE_LAN;
		}

		Rect.HSplitTop(Spacing, 0, &Rect);
		Rect.HSplitTop(25.0f, &Box, &Rect);
	}

	if((Client()->State() == IClient::STATE_OFFLINE && m_MenuPage == PAGE_SETTINGS) || (Client()->State() == IClient::STATE_ONLINE && m_GamePage == PAGE_SETTINGS))
	{
		int NumButtons = 5;
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/NumButtons)-(Spacing*(NumButtons-1))/NumButtons;
		float NotActiveAlpha = Client()->State() == IClient::STATE_ONLINE ? 0.5f : 1.0f;
		int Corners = Client()->State() == IClient::STATE_ONLINE ? CUIRect::CORNER_T : CUIRect::CORNER_ALL;

		// render header background
		if(Client()->State() == IClient::STATE_OFFLINE)
			RenderBackgroundShadow(&Box, false);

		Box.HSplitBottom(25.0f, 0, &Box);

		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_GeneralButton;
		if(DoButton_MenuTabTop(&s_GeneralButton, Localize("General"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_GENERAL, &Button,
			Config()->m_UiSettingsPage == SETTINGS_GENERAL ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_GENERAL);
			Config()->m_UiSettingsPage = SETTINGS_GENERAL;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		{
			static CButtonContainer s_PlayerButton;
			if(DoButton_MenuTabTop(&s_PlayerButton, Localize("Player"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage == SETTINGS_PLAYER, &Button,
				Config()->m_UiSettingsPage == SETTINGS_PLAYER ? 1.0f : NotActiveAlpha, 1.0f, Corners))
			{
				m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_PLAYER);
				Config()->m_UiSettingsPage = SETTINGS_PLAYER;
			}
		}


		// TODO: replace tee page to something else
		// Box.VSplitLeft(Spacing, 0, &Box); // little space
		// Box.VSplitLeft(ButtonWidth, &Button, &Box);
		// {
		// 	static CButtonContainer s_TeeButton;
		// 	if(DoButton_MenuTabTop(&s_TeeButton, Localize("TBD"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage == SETTINGS_TBD, &Button,
		// 		Config()->m_UiSettingsPage == SETTINGS_TBD ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		// 	{
		// 		m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_TBD);
		// 		Config()->m_UiSettingsPage = SETTINGS_TBD;
		// 	}
		// }

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_ControlsButton;
		if(DoButton_MenuTabTop(&s_ControlsButton, Localize("Controls"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_CONTROLS, &Button,
			Config()->m_UiSettingsPage == SETTINGS_CONTROLS ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_CONTROLS);
			Config()->m_UiSettingsPage = SETTINGS_CONTROLS;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_GraphicsButton;
		if(DoButton_MenuTabTop(&s_GraphicsButton, Localize("Graphics"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_GRAPHICS, &Button,
			Config()->m_UiSettingsPage == SETTINGS_GRAPHICS ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_GRAPHICS);
			Config()->m_UiSettingsPage = SETTINGS_GRAPHICS;
		}

		Box.VSplitLeft(Spacing, 0, &Box); // little space
		Box.VSplitLeft(ButtonWidth, &Button, &Box);
		static CButtonContainer s_SoundButton;
		if(DoButton_MenuTabTop(&s_SoundButton, Localize("Sound"), Client()->State() == IClient::STATE_OFFLINE && Config()->m_UiSettingsPage==SETTINGS_SOUND, &Button,
			Config()->m_UiSettingsPage == SETTINGS_SOUND ? 1.0f : NotActiveAlpha, 1.0f, Corners))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_SETTINGS_SOUND);
			Config()->m_UiSettingsPage = SETTINGS_SOUND;
		}
	}
	else if((Client()->State() == IClient::STATE_OFFLINE && m_MenuPage >= PAGE_INTERNET && m_MenuPage <= PAGE_LAN) || (Client()->State() == IClient::STATE_ONLINE && m_GamePage >= PAGE_INTERNET && m_GamePage <= PAGE_LAN))
	{
		float Spacing = 3.0f;
		float ButtonWidth = (Box.w/6.0f)-(Spacing*5.0)/6.0f;
		int Corners = Client()->State() == IClient::STATE_ONLINE ? CUIRect::CORNER_T : CUIRect::CORNER_ALL;
		float NotActiveAlpha = Client()->State() == IClient::STATE_ONLINE ? 0.5f : 1.0f;

		CUIRect Left;
		Box.VSplitLeft(ButtonWidth*2.0f+Spacing, &Left, 0);

		// render header backgrounds
		if(Client()->State() == IClient::STATE_OFFLINE)
			RenderBackgroundShadow(&Left, false);

		Left.HSplitBottom(25.0f, 0, &Left);

		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_InternetButton;
		if(DoButton_MenuTabTop(&s_InternetButton, Localize("Global"), m_ActivePage==PAGE_INTERNET && Client()->State() == IClient::STATE_OFFLINE, &Button,
			m_ActivePage==PAGE_INTERNET ? 1.0f : NotActiveAlpha, 1.0f, Corners) || CheckHotKey(KEY_G))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_INTERNET);
			ServerBrowser()->SetType(IServerBrowser::TYPE_INTERNET);
			NewPage = PAGE_INTERNET;
			Config()->m_UiBrowserPage = PAGE_INTERNET;
		}

		Left.VSplitLeft(Spacing, 0, &Left); // little space
		Left.VSplitLeft(ButtonWidth, &Button, &Left);
		static CButtonContainer s_LanButton;
		if(DoButton_MenuTabTop(&s_LanButton, Localize("Local"), m_ActivePage==PAGE_LAN && Client()->State() == IClient::STATE_OFFLINE, &Button,
			m_ActivePage==PAGE_LAN ? 1.0f : NotActiveAlpha, 1.0f, Corners) || CheckHotKey(KEY_L))
		{
			m_pClient->m_pCamera->ChangePosition(CCamera::POS_LAN);
			ServerBrowser()->SetType(IServerBrowser::TYPE_LAN);
			NewPage = PAGE_LAN;
			Config()->m_UiBrowserPage = PAGE_LAN;
		}

		if(Client()->State() == IClient::STATE_OFFLINE)
		{
			CUIRect Right, Button;
			Box.VSplitRight(20.0f, &Box, 0);
			Box.VSplitRight(60.0f, 0, &Right);
			Right.HSplitBottom(20.0f, 0, &Button);
		}
	}
	else if(Client()->State() == IClient::STATE_OFFLINE)
	{
		if(m_MenuPage == PAGE_DEMOS)
		{
			// render header background
			RenderBackgroundShadow(&Box, false);

			Box.HSplitBottom(25.0f, 0, &Box);

			// make the header look like an active tab
			Box.Draw(vec4(1.0f, 1.0f, 1.0f, 0.75f));
			UI()->DoLabelSelected(&Box, Localize("Demos"), true, Box.h*CUI::ms_FontmodHeight, TEXTALIGN_MC);
		}
	}



	if(NewPage != -1)
	{
		if(Client()->State() == IClient::STATE_OFFLINE)
			SetMenuPage(NewPage);
		else
		{
			m_GamePage = NewPage;
			if(NewPage == PAGE_INTERNET || NewPage == PAGE_LAN)
				SetMenuPage(NewPage);
		}
	}
}